

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_error_t
apx_vm_serializer_pack_int8
          (apx_vm_serializer_t *self,uint32_t array_length,apx_sizeType_t dynamic_size_type)

{
  apx_error_t result;
  apx_sizeType_t dynamic_size_type_local;
  uint32_t array_length_local;
  apx_vm_serializer_t *self_local;
  
  if (self == (apx_vm_serializer_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    self_local._4_4_ = serializer_prepare_for_buffer_write(self,'\x05',1);
    if (self_local._4_4_ == 0) {
      if (self->state == (apx_vm_writeState_t *)0x0) {
        __assert_fail("self->state != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x163,
                      "apx_error_t apx_vm_serializer_pack_int8(apx_vm_serializer_t *, uint32_t, apx_sizeType_t)"
                     );
      }
      self_local._4_4_ = serializer_prepare_for_array(self,array_length,dynamic_size_type);
      if (self_local._4_4_ == 0) {
        self_local._4_4_ = serializer_pack_value(self);
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_serializer_pack_int8(apx_vm_serializer_t* self, uint32_t array_length, apx_sizeType_t dynamic_size_type)
{
   if (self != NULL)
   {
      apx_error_t result = serializer_prepare_for_buffer_write(self, APX_TYPE_CODE_INT8, INT8_SIZE);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      assert(self->state != NULL);
      result = serializer_prepare_for_array(self, array_length, dynamic_size_type);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      return serializer_pack_value(self);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}